

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair
          (DictionaryValue_KeyValuePair *this,DictionaryValue_KeyValuePair *from)

{
  Value *pVVar1;
  Value *pVVar2;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__DictionaryValue_KeyValuePair_003fa9c0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  pVVar1 = from->key_;
  if (pVVar1 == (Value *)0x0 ||
      from == (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    pVVar2 = (Value *)0x0;
  }
  else {
    pVVar2 = (Value *)operator_new(0x30);
    Value::Value(pVVar2,pVVar1);
  }
  this->key_ = pVVar2;
  pVVar1 = from->value_;
  if (pVVar1 == (Value *)0x0 ||
      from == (DictionaryValue_KeyValuePair *)_DictionaryValue_KeyValuePair_default_instance_) {
    pVVar2 = (Value *)0x0;
  }
  else {
    pVVar2 = (Value *)operator_new(0x30);
    Value::Value(pVVar2,pVVar1);
  }
  this->value_ = pVVar2;
  return;
}

Assistant:

DictionaryValue_KeyValuePair::DictionaryValue_KeyValuePair(const DictionaryValue_KeyValuePair& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_key()) {
    key_ = new ::CoreML::Specification::MILSpec::Value(*from.key_);
  } else {
    key_ = nullptr;
  }
  if (from._internal_has_value()) {
    value_ = new ::CoreML::Specification::MILSpec::Value(*from.value_);
  } else {
    value_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.MILSpec.DictionaryValue.KeyValuePair)
}